

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmCTest *pcVar5;
  size_type sVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long *plVar12;
  ostream *poVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  string memoryTesterOptions;
  string extraOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string outputFile;
  string suppressionsOption;
  string testerName;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  pointer pbStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  (this->MemoryTesterEnvironmentVariable)._M_string_length = 0;
  *(this->MemoryTesterEnvironmentVariable)._M_dataplus._M_p = '\0';
  (this->MemoryTester)._M_string_length = 0;
  *(this->MemoryTester)._M_dataplus._M_p = '\0';
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  paVar2 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckCommand","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  psVar1 = &this->MemoryTester;
  if (bVar8) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemTools::GetFilenameName((string *)local_1a8,psVar1);
    lVar11 = std::__cxx11::string::find((char *)local_1a8,0x594079,0);
    if (lVar11 == -1) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"MemoryCheckType","");
      cmCTest::GetCTestConfiguration(&local_268,pcVar5,&local_248);
      iVar9 = std::__cxx11::string::compare((char *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        (ulong)(local_248.field_2._M_allocated_capacity + 1));
      }
      if (iVar9 == 0) goto LAB_0018ef9a;
      lVar11 = std::__cxx11::string::find(local_1a8,0x594092,0);
      if (lVar11 == -1) {
        lVar11 = std::__cxx11::string::find(local_1a8,0x594099,0);
        if (lVar11 == -1) {
          this->MemoryTesterStyle = 0;
        }
        else {
          this->MemoryTesterStyle = 3;
        }
      }
      else {
        this->MemoryTesterStyle = 2;
      }
    }
    else {
LAB_0018ef9a:
      this->MemoryTesterStyle = 1;
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"PurifyCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    if (bVar8) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"PurifyCommand","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ValgrindCommand","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      if (bVar8) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ValgrindCommand","");
        cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
        std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_268._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"BoundsCheckerCommand","");
        cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
        bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        if (bVar8) {
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_268._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"BoundsCheckerCommand","");
          cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
          std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != paVar2) {
            operator_delete(local_268._M_dataplus._M_p,
                            CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                     local_268.field_2._M_local_buf[0]) + 1);
          }
          this->MemoryTesterStyle = 3;
        }
      }
    }
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  iVar9 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 4;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  iVar9 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 5;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  iVar9 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  iVar9 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
  iVar9 = std::__cxx11::string::compare(local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  else if (this->MemoryTesterStyle == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckType","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    iVar9 = std::__cxx11::string::compare(local_1a8);
    if (iVar9 == 0) {
      iVar9 = 2;
LAB_0018f9c2:
      this->MemoryTesterStyle = iVar9;
    }
    else {
      iVar9 = std::__cxx11::string::compare(local_1a8);
      if (iVar9 == 0) {
        iVar9 = 3;
        goto LAB_0018f9c2;
      }
      iVar9 = std::__cxx11::string::compare(local_1a8);
      if (iVar9 == 0) {
        iVar9 = 1;
        goto LAB_0018f9c2;
      }
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->MemoryTester)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program.",
               0x52);
    std::ios::widen((char)(ostringstream *)local_1a8 +
                    (char)*(undefined8 *)((long)local_1a8 + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1fb,local_268._M_dataplus._M_p,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return false;
  }
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"MemoryCheckCommandOptions","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
  pbVar7 = pbStack_1a0;
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,(ulong)(local_248.field_2._M_allocated_capacity + 1))
    ;
  }
  if (pbVar7 == (pointer)0x0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"ValgrindCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      (ulong)(local_248.field_2._M_allocated_capacity + 1));
    }
    if (pbStack_1a0 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,"ValgrindCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
      goto LAB_0018fc62;
    }
  }
  else {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"MemoryCheckCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
LAB_0018fc62:
    std::__cxx11::string::operator=((string *)&local_268,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      (ulong)(local_248.field_2._M_allocated_capacity + 1));
    }
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_248,&local_268);
  local_198[0]._0_8_ =
       (this->MemoryTesterOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_248.field_2._M_allocated_capacity;
  local_1a8 = (undefined1  [8])
              (this->MemoryTesterOptions).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_1a0 = (this->MemoryTesterOptions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_248._M_dataplus._M_p;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_248._M_string_length;
  local_248._M_dataplus._M_p = (pointer)0x0;
  local_248._M_string_length = 0;
  local_248.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&local_248,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_248);
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 == paVar14) {
    local_198[0]._0_8_ = paVar14->_M_allocated_capacity;
    local_198[0]._8_8_ = plVar12[3];
    local_1a8 = (undefined1  [8])local_198;
  }
  else {
    local_198[0]._0_8_ = paVar14->_M_allocated_capacity;
    local_1a8 = (undefined1  [8])*plVar12;
  }
  pbStack_1a0 = (pointer)plVar12[1];
  *plVar12 = (long)paVar14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  psVar1 = &this->MemoryTesterOutputFile;
  std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  iVar9 = this->MemoryTesterStyle;
  if (iVar9 - 1U < 8) {
    this_00 = &this->MemoryTesterOptions;
    switch(iVar9) {
    case 1:
      if ((this->MemoryTesterOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->MemoryTesterOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [3])0x5d6e52);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [16])"--tool=memcheck");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [17])"--leak-check=yes");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[21]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [21])"--show-reachable=yes");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [17])"--num-callers=50");
      }
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
      pbVar7 = pbStack_1a0;
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (pbVar7 != (pointer)0x0) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar5,&local_248);
        bVar8 = cmsys::SystemTools::FileExists((string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Cannot find memory checker suppression file: ",0x2d);
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"MemoryCheckSuppressionFile","");
          cmCTest::GetCTestConfiguration(&local_248,pcVar5,&local_1c8);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_248._M_dataplus._M_p,
                               local_248._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                     local_1c8.field_2._M_local_buf[0]) + 1);
          }
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x221,local_248._M_dataplus._M_p,false);
          goto LAB_001909ce;
        }
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_248,pcVar5,&local_1c8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"--suppressions=",&local_248);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,
                          CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                   local_1c8.field_2._M_local_buf[0]) + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "--log-file=",psVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      break;
    case 2:
      local_1a8 = (undefined1  [8])local_198;
      pbStack_1a0 = (pointer)0x0;
      local_198[0]._M_allocated_capacity = local_198[0]._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::_M_replace((ulong)local_1a8,0,(char *)0x0,0x59421c);
      std::__cxx11::string::_M_append
                (local_1a8,(ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_1a8);
      break;
    case 3:
      std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerXMLFile);
      cmCTest::GetBinaryDir_abi_cxx11_
                (&local_248,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_1a8 = (undefined1  [8])local_198;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar14) {
        local_198[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_198[0]._8_8_ = plVar12[3];
      }
      else {
        local_198[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_1a8 = (undefined1  [8])*plVar12;
      }
      pbStack_1a0 = (pointer)plVar12[1];
      *plVar12 = (long)paVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerDPBDFile);
      this_01 = &this->MemoryTesterDynamicOptions;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (char (*) [3])"/B");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (char (*) [3])"/X");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,psVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])"/M");
      break;
    default:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [4])"env");
      local_1a8 = (undefined1  [8])local_198;
      pbStack_1a0 = (pointer)0x0;
      local_198[0]._M_allocated_capacity = local_198[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length = 0;
      local_248.field_2._M_allocated_capacity =
           local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      paVar14 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSanitizerOptions","");
      cmCTest::GetCTestConfiguration(&local_1e8,pcVar5,&local_228);
      sVar6 = local_1e8._M_string_length;
      paVar4 = &local_1e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar4) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar14) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (sVar6 != 0) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,"MemoryCheckSanitizerOptions","");
        cmCTest::GetCTestConfiguration(&local_228,pcVar5,&local_208);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x5ba0dc);
        psVar15 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_1e8.field_2._M_allocated_capacity = *psVar15;
          local_1e8.field_2._8_8_ = plVar12[3];
          local_1e8._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *psVar15;
          local_1e8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_1e8._M_string_length = plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_248,(string *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar4) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar14) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_228._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration(&local_1e8,pcVar5,&local_228);
      sVar6 = local_1e8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar4) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar14) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (sVar6 != 0) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_228,pcVar5,&local_208);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x594279);
        psVar15 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_1e8.field_2._M_allocated_capacity = *psVar15;
          local_1e8.field_2._8_8_ = plVar12[3];
          local_1e8._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_1e8.field_2._M_allocated_capacity = *psVar15;
          local_1e8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_1e8._M_string_length = plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar4) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar14) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      uVar10 = this->MemoryTesterStyle - 4;
      if (uVar10 < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)local_1a8,0,(char *)pbStack_1a0,
                   (ulong)(&DAT_00593c4c + *(int *)(&DAT_00593c4c + (ulong)uVar10 * 4)));
      }
      paVar3 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_1a8,
                 (char *)((long)local_1a8 + (long)&pbStack_1a0->_M_dataplus));
      std::__cxx11::string::append((char *)&local_208);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_208,
                                   (ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_228.field_2._M_allocated_capacity = *psVar15;
        local_228.field_2._8_8_ = plVar12[3];
        local_228._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar15;
        local_228._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_228._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_228);
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_1e8.field_2._M_allocated_capacity = *psVar15;
        local_1e8.field_2._8_8_ = plVar12[3];
        local_1e8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_1e8.field_2._M_allocated_capacity = *psVar15;
        local_1e8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_1e8._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar14) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar3) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_208,&local_1e8,&local_1c8);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_208,(ulong)local_248._M_dataplus._M_p);
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_228.field_2._M_allocated_capacity = *psVar15;
        local_228.field_2._8_8_ = plVar12[3];
        local_228._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar15;
        local_228._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_228._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar14) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar3) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar4) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    bVar8 = true;
    InitializeResultsVectors(this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Do not understand memory checker: ",0x22);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(this->MemoryTester)._M_dataplus._M_p,
                         (this->MemoryTester)._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x289,local_248._M_dataplus._M_p,false);
LAB_001909ce:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}